

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::ShaderCommonFunctionTests::init
          (ShaderCommonFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  bool bVar2;
  DataType baseType;
  DataType baseType_00;
  int extraout_EAX;
  TestNode *pTVar3;
  TestNode *pTVar4;
  TestNode *pTVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  uint vecSize;
  ShaderType SVar9;
  int prec;
  Precision PVar10;
  
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"abs","abs");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar7 = 0;
  do {
    iVar1 = (&DAT_00b1d628)[lVar7];
    iVar6 = 1;
    do {
      PVar10 = PRECISION_LOWP;
      do {
        SVar9 = SHADERTYPE_VERTEX;
        bVar2 = true;
        do {
          bVar8 = bVar2;
          pTVar4 = (TestNode *)operator_new(0x280);
          AbsCase::AbsCase((AbsCase *)pTVar4,(this->super_TestCaseGroup).m_context,
                           iVar1 + -1 + iVar6,PVar10,SVar9);
          tcu::TestNode::addChild(pTVar3,pTVar4);
          SVar9 = SHADERTYPE_FRAGMENT;
          bVar2 = false;
        } while (bVar8);
        PVar10 = PVar10 + PRECISION_MEDIUMP;
      } while (PVar10 != PRECISION_LAST);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 5);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 2);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sign","sign")
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar7 = 0;
  do {
    iVar1 = (&DAT_00b1d628)[lVar7];
    iVar6 = 1;
    do {
      PVar10 = PRECISION_LOWP;
      do {
        SVar9 = SHADERTYPE_VERTEX;
        bVar2 = true;
        do {
          bVar8 = bVar2;
          pTVar4 = (TestNode *)operator_new(0x280);
          SignCase::SignCase((SignCase *)pTVar4,(this->super_TestCaseGroup).m_context,
                             iVar1 + -1 + iVar6,PVar10,SVar9);
          tcu::TestNode::addChild(pTVar3,pTVar4);
          SVar9 = SHADERTYPE_FRAGMENT;
          bVar2 = false;
        } while (bVar8);
        PVar10 = PVar10 + PRECISION_MEDIUMP;
      } while (PVar10 != PRECISION_LAST);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 5);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 2);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"floor",
             "floor");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar7 = 0;
  do {
    if (1 < (int)lVar7 - 1U) {
      iVar1 = (&DAT_00b1d628)[lVar7];
      iVar6 = 1;
      do {
        PVar10 = PRECISION_LOWP;
        do {
          SVar9 = SHADERTYPE_VERTEX;
          bVar2 = true;
          do {
            bVar8 = bVar2;
            pTVar4 = (TestNode *)operator_new(0x280);
            FloorCase::FloorCase
                      ((FloorCase *)pTVar4,(this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar6,
                       PVar10,SVar9);
            tcu::TestNode::addChild(pTVar3,pTVar4);
            SVar9 = SHADERTYPE_FRAGMENT;
            bVar2 = false;
          } while (bVar8);
          PVar10 = PVar10 + PRECISION_MEDIUMP;
        } while (PVar10 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"trunc",
             "trunc");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar7 = 0;
  do {
    if (1 < (int)lVar7 - 1U) {
      iVar1 = (&DAT_00b1d628)[lVar7];
      iVar6 = 1;
      do {
        PVar10 = PRECISION_LOWP;
        do {
          SVar9 = SHADERTYPE_VERTEX;
          bVar2 = true;
          do {
            bVar8 = bVar2;
            pTVar4 = (TestNode *)operator_new(0x280);
            TruncCase::TruncCase
                      ((TruncCase *)pTVar4,(this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar6,
                       PVar10,SVar9);
            tcu::TestNode::addChild(pTVar3,pTVar4);
            SVar9 = SHADERTYPE_FRAGMENT;
            bVar2 = false;
          } while (bVar8);
          PVar10 = PVar10 + PRECISION_MEDIUMP;
        } while (PVar10 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"round",
             "round");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar7 = 0;
  do {
    if (1 < (int)lVar7 - 1U) {
      iVar1 = (&DAT_00b1d628)[lVar7];
      iVar6 = 1;
      do {
        PVar10 = PRECISION_LOWP;
        do {
          SVar9 = SHADERTYPE_VERTEX;
          bVar2 = true;
          do {
            bVar8 = bVar2;
            pTVar4 = (TestNode *)operator_new(0x280);
            RoundCase::RoundCase
                      ((RoundCase *)pTVar4,(this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar6,
                       PVar10,SVar9);
            tcu::TestNode::addChild(pTVar3,pTVar4);
            SVar9 = SHADERTYPE_FRAGMENT;
            bVar2 = false;
          } while (bVar8);
          PVar10 = PVar10 + PRECISION_MEDIUMP;
        } while (PVar10 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"roundeven",
             "roundeven");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar7 = 0;
  do {
    if (1 < (int)lVar7 - 1U) {
      iVar1 = (&DAT_00b1d628)[lVar7];
      iVar6 = 1;
      do {
        PVar10 = PRECISION_LOWP;
        do {
          SVar9 = SHADERTYPE_VERTEX;
          bVar2 = true;
          do {
            bVar8 = bVar2;
            pTVar4 = (TestNode *)operator_new(0x280);
            RoundEvenCase::RoundEvenCase
                      ((RoundEvenCase *)pTVar4,(this->super_TestCaseGroup).m_context,
                       iVar1 + -1 + iVar6,PVar10,SVar9);
            tcu::TestNode::addChild(pTVar3,pTVar4);
            SVar9 = SHADERTYPE_FRAGMENT;
            bVar2 = false;
          } while (bVar8);
          PVar10 = PVar10 + PRECISION_MEDIUMP;
        } while (PVar10 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"ceil","ceil")
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar7 = 0;
  do {
    if (1 < (int)lVar7 - 1U) {
      iVar1 = (&DAT_00b1d628)[lVar7];
      iVar6 = 1;
      do {
        PVar10 = PRECISION_LOWP;
        do {
          SVar9 = SHADERTYPE_VERTEX;
          bVar2 = true;
          do {
            bVar8 = bVar2;
            pTVar4 = (TestNode *)operator_new(0x280);
            CeilCase::CeilCase((CeilCase *)pTVar4,(this->super_TestCaseGroup).m_context,
                               iVar1 + -1 + iVar6,PVar10,SVar9);
            tcu::TestNode::addChild(pTVar3,pTVar4);
            SVar9 = SHADERTYPE_FRAGMENT;
            bVar2 = false;
          } while (bVar8);
          PVar10 = PVar10 + PRECISION_MEDIUMP;
        } while (PVar10 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fract",
             "fract");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar7 = 0;
  do {
    if (1 < (int)lVar7 - 1U) {
      iVar1 = (&DAT_00b1d628)[lVar7];
      iVar6 = 1;
      do {
        PVar10 = PRECISION_LOWP;
        do {
          SVar9 = SHADERTYPE_VERTEX;
          bVar2 = true;
          do {
            bVar8 = bVar2;
            pTVar4 = (TestNode *)operator_new(0x280);
            FractCase::FractCase
                      ((FractCase *)pTVar4,(this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar6,
                       PVar10,SVar9);
            tcu::TestNode::addChild(pTVar3,pTVar4);
            SVar9 = SHADERTYPE_FRAGMENT;
            bVar2 = false;
          } while (bVar8);
          PVar10 = PVar10 + PRECISION_MEDIUMP;
        } while (PVar10 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"modf","modf")
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar7 = 0;
  do {
    if (1 < (int)lVar7 - 1U) {
      iVar1 = (&DAT_00b1d628)[lVar7];
      iVar6 = 1;
      do {
        PVar10 = PRECISION_LOWP;
        do {
          SVar9 = SHADERTYPE_VERTEX;
          bVar2 = true;
          do {
            bVar8 = bVar2;
            pTVar4 = (TestNode *)operator_new(0x280);
            ModfCase::ModfCase((ModfCase *)pTVar4,(this->super_TestCaseGroup).m_context,
                               iVar1 + -1 + iVar6,PVar10,SVar9);
            tcu::TestNode::addChild(pTVar3,pTVar4);
            SVar9 = SHADERTYPE_FRAGMENT;
            bVar2 = false;
          } while (bVar8);
          PVar10 = PVar10 + PRECISION_MEDIUMP;
        } while (PVar10 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"isnan",
             "isnan");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar7 = 0;
  do {
    if (1 < (int)lVar7 - 1U) {
      iVar1 = (&DAT_00b1d628)[lVar7];
      iVar6 = 1;
      do {
        PVar10 = PRECISION_LOWP;
        do {
          SVar9 = SHADERTYPE_VERTEX;
          bVar2 = true;
          do {
            bVar8 = bVar2;
            pTVar4 = (TestNode *)operator_new(0x280);
            IsnanCase::IsnanCase
                      ((IsnanCase *)pTVar4,(this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar6,
                       PVar10,SVar9);
            tcu::TestNode::addChild(pTVar3,pTVar4);
            SVar9 = SHADERTYPE_FRAGMENT;
            bVar2 = false;
          } while (bVar8);
          PVar10 = PVar10 + PRECISION_MEDIUMP;
        } while (PVar10 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"isinf",
             "isinf");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar7 = 0;
  do {
    if (1 < (int)lVar7 - 1U) {
      iVar1 = (&DAT_00b1d628)[lVar7];
      iVar6 = 1;
      do {
        PVar10 = PRECISION_LOWP;
        do {
          SVar9 = SHADERTYPE_VERTEX;
          bVar2 = true;
          do {
            bVar8 = bVar2;
            pTVar4 = (TestNode *)operator_new(0x280);
            IsinfCase::IsinfCase
                      ((IsinfCase *)pTVar4,(this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar6,
                       PVar10,SVar9);
            tcu::TestNode::addChild(pTVar3,pTVar4);
            SVar9 = SHADERTYPE_FRAGMENT;
            bVar2 = false;
          } while (bVar8);
          PVar10 = PVar10 + PRECISION_MEDIUMP;
        } while (PVar10 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "floatbitstoint","floatbitstoint");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar7 = 0;
  do {
    if (1 < (int)lVar7 - 1U) {
      iVar1 = (&DAT_00b1d628)[lVar7];
      iVar6 = 1;
      do {
        PVar10 = PRECISION_LOWP;
        do {
          SVar9 = SHADERTYPE_VERTEX;
          bVar2 = true;
          do {
            bVar8 = bVar2;
            pTVar4 = (TestNode *)operator_new(0x280);
            FloatBitsToUintIntCase::FloatBitsToUintIntCase
                      ((FloatBitsToUintIntCase *)pTVar4,(this->super_TestCaseGroup).m_context,
                       iVar1 + -1 + iVar6,PVar10,SVar9,true);
            pTVar4->_vptr_TestNode = (_func_int **)&PTR__CommonFunctionCase_00d0e4a0;
            tcu::TestNode::addChild(pTVar3,pTVar4);
            SVar9 = SHADERTYPE_FRAGMENT;
            bVar2 = false;
          } while (bVar8);
          PVar10 = PVar10 + PRECISION_MEDIUMP;
        } while (PVar10 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "floatbitstouint","floatbitstouint");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar7 = 0;
  do {
    if (1 < (int)lVar7 - 1U) {
      iVar1 = (&DAT_00b1d628)[lVar7];
      iVar6 = 1;
      do {
        PVar10 = PRECISION_LOWP;
        do {
          SVar9 = SHADERTYPE_VERTEX;
          bVar2 = true;
          do {
            bVar8 = bVar2;
            pTVar4 = (TestNode *)operator_new(0x280);
            FloatBitsToUintIntCase::FloatBitsToUintIntCase
                      ((FloatBitsToUintIntCase *)pTVar4,(this->super_TestCaseGroup).m_context,
                       iVar1 + -1 + iVar6,PVar10,SVar9,false);
            pTVar4->_vptr_TestNode = (_func_int **)&PTR__CommonFunctionCase_00d0e560;
            tcu::TestNode::addChild(pTVar3,pTVar4);
            SVar9 = SHADERTYPE_FRAGMENT;
            bVar2 = false;
          } while (bVar8);
          PVar10 = PVar10 + PRECISION_MEDIUMP;
        } while (PVar10 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "intbitstofloat","intBitsToFloat() Tests");
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "uintbitstofloat","uintBitsToFloat() Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  vecSize = 1;
  do {
    if (vecSize < 2) {
      baseType_00 = TYPE_UINT;
      baseType = TYPE_INT;
    }
    else {
      baseType = glu::getDataTypeIntVec(vecSize);
      baseType_00 = glu::getDataTypeUintVec(vecSize);
    }
    SVar9 = SHADERTYPE_VERTEX;
    bVar2 = true;
    do {
      bVar8 = bVar2;
      pTVar5 = (TestNode *)operator_new(0x280);
      BitsToFloatCase::BitsToFloatCase
                ((BitsToFloatCase *)pTVar5,(this->super_TestCaseGroup).m_context,baseType,SVar9);
      tcu::TestNode::addChild(pTVar3,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x280);
      BitsToFloatCase::BitsToFloatCase
                ((BitsToFloatCase *)pTVar5,(this->super_TestCaseGroup).m_context,baseType_00,SVar9);
      tcu::TestNode::addChild(pTVar4,pTVar5);
      SVar9 = SHADERTYPE_FRAGMENT;
      bVar2 = false;
    } while (bVar8);
    vecSize = vecSize + 1;
  } while (vecSize != 4);
  return extraout_EAX;
}

Assistant:

void ShaderCommonFunctionTests::init (void)
{
	//																	Float?	Int?	Uint?
	addFunctionCases<AbsCase>				(this,	"abs",				true,	true,	false);
	addFunctionCases<SignCase>				(this,	"sign",				true,	true,	false);
	addFunctionCases<FloorCase>				(this,	"floor",			true,	false,	false);
	addFunctionCases<TruncCase>				(this,	"trunc",			true,	false,	false);
	addFunctionCases<RoundCase>				(this,	"round",			true,	false,	false);
	addFunctionCases<RoundEvenCase>			(this,	"roundeven",		true,	false,	false);
	addFunctionCases<CeilCase>				(this,	"ceil",				true,	false,	false);
	addFunctionCases<FractCase>				(this,	"fract",			true,	false,	false);
	// mod
	addFunctionCases<ModfCase>				(this,	"modf",				true,	false,	false);
	// min
	// max
	// clamp
	// mix
	// step
	// smoothstep
	addFunctionCases<IsnanCase>				(this,	"isnan",			true,	false,	false);
	addFunctionCases<IsinfCase>				(this,	"isinf",			true,	false,	false);
	addFunctionCases<FloatBitsToIntCase>	(this,	"floatbitstoint",	true,	false,	false);
	addFunctionCases<FloatBitsToUintCase>	(this,	"floatbitstouint",	true,	false,	false);

	// (u)intBitsToFloat()
	{
		tcu::TestCaseGroup* intGroup	= new tcu::TestCaseGroup(m_testCtx, "intbitstofloat",	"intBitsToFloat() Tests");
		tcu::TestCaseGroup* uintGroup	= new tcu::TestCaseGroup(m_testCtx, "uintbitstofloat",	"uintBitsToFloat() Tests");

		addChild(intGroup);
		addChild(uintGroup);

		for (int vecSize = 1; vecSize < 4; vecSize++)
		{
			const glu::DataType		intType		= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::DataType		uintType	= vecSize > 1 ? glu::getDataTypeUintVec(vecSize) : glu::TYPE_UINT;

			for (int shaderType = glu::SHADERTYPE_VERTEX; shaderType <= glu::SHADERTYPE_FRAGMENT; shaderType++)
			{
				intGroup->addChild(new BitsToFloatCase(m_context, intType, glu::ShaderType(shaderType)));
				uintGroup->addChild(new BitsToFloatCase(m_context, uintType, glu::ShaderType(shaderType)));
			}
		}
	}
}